

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeTry(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Builder *this_01;
  long *plVar1;
  _Storage<wasm::Type,_true> _Var2;
  undefined1 auVar3 [16];
  char *pcVar4;
  optional<wasm::Type> type_00;
  uint32_t uVar5;
  Index index;
  Expression *body;
  value_type *pvVar6;
  ulong uVar7;
  Expression *value;
  LocalSet *left;
  Try *pTVar8;
  ulong uVar9;
  ulong uVar10;
  Module *pMVar11;
  Type in_R8;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  Name NVar16;
  optional<wasm::Type> type_01;
  undefined1 local_e8 [8];
  unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
  usedTags;
  _Storage<wasm::Type,_true> _Stack_90;
  Tag *tag;
  TranslateToFuzzReader *local_80;
  Block *pBStack_78;
  Expression *catchBody;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> catchBodies;
  undefined1 auStack_48 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  
  usedTags._M_h._M_single_bucket = (__node_base_ptr)type.id;
  body = make(this,type);
  catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00 = &this->random;
  uVar5 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
  local_e8 = (undefined1  [8])&usedTags._M_h._M_rehash_policy._M_next_resize;
  usedTags._M_h._M_buckets = (__buckets_ptr)0x1;
  usedTags._M_h._M_bucket_count = 0;
  usedTags._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedTags._M_h._M_element_count._0_4_ = 0x3f800000;
  usedTags._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedTags._M_h._M_rehash_policy._4_4_ = 0;
  usedTags._M_h._M_rehash_policy._M_next_resize = 0;
  uVar9 = 1;
  uVar14 = 0;
  if (uVar5 != 0) {
    do {
      pMVar11 = this->wasm;
      if (*(long *)(pMVar11 + 0x48) == *(long *)(pMVar11 + 0x50)) {
        addTag(this);
        pMVar11 = this->wasm;
      }
      pvVar6 = Random::
               pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                         (this_00,(vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                   *)(pMVar11 + 0x48));
      _Stack_90._M_value.id =
           (Type)(pvVar6->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                 super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      in_R8.id = (uintptr_t)usedTags._M_h._M_buckets;
      if (*(long **)((long)local_e8 + ((ulong)_Stack_90 % (ulong)usedTags._M_h._M_buckets) * 8) !=
          (long *)0x0) {
        plVar1 = (long *)**(long **)((long)local_e8 +
                                    ((ulong)_Stack_90 % (ulong)usedTags._M_h._M_buckets) * 8);
        _Var2 = *(_Storage<wasm::Type,_true> *)(plVar1 + 1);
        do {
          if (_Stack_90 == _Var2) goto LAB_0012ebf4;
          plVar1 = (long *)*plVar1;
        } while ((plVar1 != (long *)0x0) &&
                (_Var2 = *(_Storage<wasm::Type,_true> *)(plVar1 + 1),
                (ulong)_Var2 % (ulong)usedTags._M_h._M_buckets ==
                (ulong)_Stack_90 % (ulong)usedTags._M_h._M_buckets));
      }
      pBStack_78 = (Block *)local_e8;
      std::
      _Hashtable<wasm::Tag*,wasm::Tag*,std::allocator<wasm::Tag*>,std::__detail::_Identity,std::equal_to<wasm::Tag*>,std::hash<wasm::Tag*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::Tag*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Tag*,false>>>>
                ((_Hashtable<wasm::Tag*,wasm::Tag*,std::allocator<wasm::Tag*>,std::__detail::_Identity,std::equal_to<wasm::Tag*>,std::hash<wasm::Tag*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_e8,&_Stack_90,&pBStack_78);
      if (catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start ==
          catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                  ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_48,
                   (iterator)
                   catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start,(Name *)_Stack_90);
      }
      else {
        pcVar4 = *(char **)((long)_Stack_90 + 8);
        ((catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_len = *(size_t *)_Stack_90;
        ((catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar4;
        catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start =
             catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
LAB_0012ebf4:
      uVar13 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar13;
    } while (uVar13 != uVar5);
    uVar14 = (ulong)((long)catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_start - (long)auStack_48) >> 4;
    if ((int)uVar14 == 0) {
      uVar14 = 0;
      uVar9 = 1;
    }
    else {
      uVar5 = Random::upTo(this_00,2);
      uVar9 = uVar14 & 0xffffffff;
      if ((uVar5 == 0) && (uVar13 = (int)uVar14 + 1, uVar9 = (ulong)uVar13, uVar13 == 0))
      goto LAB_0012ed50;
    }
  }
  this_01 = &this->builder;
  lVar15 = 8;
  uVar12 = 0;
  uVar10 = uVar9;
  local_80 = this;
  do {
    if (uVar12 < (uVar14 & 0xffffffff)) {
      NVar16.super_IString.str._M_str = *(char **)((long)auStack_48 + lVar15 + -8);
      NVar16.super_IString.str._M_len = (size_t)this->wasm;
      wasm::Module::getTag(NVar16);
      uVar7 = wasm::HeapType::getSignature();
      if (uVar7 == 0) goto LAB_0012eceb;
      value = (Expression *)MixedArena::allocSpace((MixedArena *)(this_01->wasm + 0x200),0x10,8);
      value->_id = PopId;
      (value->type).id = uVar7;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      index = Builder::addVar((Builder *)local_80->funcContext->func,(Function *)0x0,
                              (Name)(auVar3 << 0x40),in_R8);
      left = Builder::makeLocalSet(this_01,index,value);
      uVar10 = uVar7;
      this = local_80;
    }
    else {
LAB_0012eceb:
      left = (LocalSet *)0x0;
    }
    pBStack_78 = (Block *)make(this,(Type)usedTags._M_h._M_single_bucket);
    if (left != (LocalSet *)0x0) {
      in_R8.id = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      pBStack_78 = Builder::makeSequence
                             (this_01,(Expression *)left,(Expression *)pBStack_78,type_01);
    }
    if (catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      _M_realloc_insert<wasm::Expression*const&>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                 (iterator)
                 catchBodies.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start,(Expression **)&pBStack_78);
    }
    else {
      *catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Expression *)pBStack_78;
      catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
    }
    uVar12 = uVar12 + 1;
    lVar15 = lVar15 + 0x10;
  } while (uVar9 != uVar12);
LAB_0012ed50:
  pBStack_78 = (Block *)0x0;
  catchBody = (Expression *)0x0;
  tag._0_1_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)tag._1_7_ << 8;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = _Stack_90;
  pTVar8 = Builder::makeTry(&this->builder,(Name)ZEXT816(0),body,
                            (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            auStack_68,(Name)ZEXT816(0),type_00);
  std::
  _Hashtable<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)catchBodies.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return (Expression *)pTVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeTry(Type type) {
  auto* body = make(type);
  std::vector<Name> catchTags;
  std::vector<Expression*> catchBodies;
  auto numTags = upTo(fuzzParams->MAX_TRY_CATCHES);
  std::unordered_set<Tag*> usedTags;
  for (Index i = 0; i < numTags; i++) {
    if (wasm.tags.empty()) {
      addTag();
    }
    auto* tag = pick(wasm.tags).get();
    if (usedTags.count(tag)) {
      continue;
    }
    usedTags.insert(tag);
    catchTags.push_back(tag->name);
  }
  // The number of tags in practice may be fewer than we planned.
  numTags = catchTags.size();
  auto numCatches = numTags;
  if (numTags == 0 || oneIn(2)) {
    // Add a catch-all.
    numCatches++;
  }
  for (Index i = 0; i < numCatches; i++) {
    // Catch bodies (aside from a catch-all) begin with a pop.
    Expression* prefix = nullptr;
    if (i < numTags) {
      auto tagType = wasm.getTag(catchTags[i])->params();
      if (tagType != Type::none) {
        auto* pop = builder.makePop(tagType);
        // Capture the pop in a local, so that it can be used later.
        // TODO: add a good chance for using this particular local in this catch
        // TODO: reuse an existing var if there is one
        auto index = builder.addVar(funcContext->func, tagType);
        prefix = builder.makeLocalSet(index, pop);
      }
    }
    auto* catchBody = make(type);
    if (prefix) {
      catchBody = builder.makeSequence(prefix, catchBody);
    }
    catchBodies.push_back(catchBody);
  }
  // TODO: delegate stuff
  return builder.makeTry(body, catchTags, catchBodies);
}